

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makePop(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Type type)

{
  bool bVar1;
  Try *pTVar2;
  size_type sVar3;
  reference ppEVar4;
  Ok local_e1;
  string local_e0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  IRBuilder *local_78;
  uintptr_t local_70;
  Type local_68;
  Type expectedType;
  allocator<char> local_49;
  Err local_48;
  ScopeCtx *local_28;
  ScopeCtx *scope;
  IRBuilder *this_local;
  Type type_local;
  
  scope = (ScopeCtx *)this;
  this_local = (IRBuilder *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  local_28 = getScope(this);
  pTVar2 = ScopeCtx::getCatch(local_28);
  if ((pTVar2 != (Try *)0x0) &&
     (sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                        (&local_28->exprStack), sVar3 == 1)) {
    ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                        (&local_28->exprStack,0);
    bVar1 = Expression::is<wasm::Pop>(*ppEVar4);
    if (bVar1) {
      ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          (&local_28->exprStack,0);
      local_70 = ((*ppEVar4)->type).id;
      local_78 = this_local;
      local_68.id = local_70;
      bVar1 = wasm::Type::isSubType((Type)local_70,(Type)this_local);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Expected pop of type ",&local_b9);
        wasm::Type::toString_abi_cxx11_(&local_e0,&local_68);
        std::operator+(&local_98,&local_b8,&local_e0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&local_98);
        wasm::Err::~Err((Err *)&local_98);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        return __return_storage_ptr__;
      }
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_e1);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"pop instructions may only appear at the beginning of catch blocks"
             ,&local_49);
  Result<wasm::Ok>::Result(__return_storage_ptr__,&local_48);
  wasm::Err::~Err(&local_48);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makePop(Type type) {
  // We don't actually want to create a new Pop expression here because we
  // already create them automatically when starting a legacy catch block that
  // needs one. Just verify that the Pop we are being asked to make is the same
  // type as the Pop we have already made.
  auto& scope = getScope();
  if (!scope.getCatch() || scope.exprStack.size() != 1 ||
      !scope.exprStack[0]->is<Pop>()) {
    return Err{
      "pop instructions may only appear at the beginning of catch blocks"};
  }
  auto expectedType = scope.exprStack[0]->type;
  if (!Type::isSubType(expectedType, type)) {
    return Err{std::string("Expected pop of type ") + expectedType.toString()};
  }
  return Ok{};
}